

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::NnPredictTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::NnPredictTest_DISABLED_Speed_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<void_(*const)(const_float_*,_const_NN_CONFIG_*,_int,_float_*)>_>::
  SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0xe8);
  anon_unknown.dwarf_f3d658::NnPredictTest_DISABLED_Speed_Test::NnPredictTest_DISABLED_Speed_Test
            ((NnPredictTest_DISABLED_Speed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }